

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O2

void calc_mean_and_sd_<double,unsigned_long,long_double>
               (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *Xc,unsigned_long *Xc_ind,
               unsigned_long *Xc_indptr,double *x_sd,double *x_mean)

{
  unsigned_long *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  unsigned_long uVar4;
  ulong uVar5;
  ulong uVar6;
  unsigned_long *puVar7;
  unsigned_long *puVar8;
  unsigned_long uVar9;
  longdouble in_ST0;
  longdouble lVar10;
  longdouble lVar11;
  longdouble in_ST1;
  longdouble lVar12;
  longdouble lVar13;
  double dVar14;
  ulong local_c0;
  ulong local_98;
  
  uVar9 = Xc_indptr[col_num];
  uVar4 = Xc_indptr[col_num + 1];
  if (uVar9 == uVar4) {
    *x_sd = 0.0;
    *x_mean = 0.0;
    return;
  }
  puVar1 = Xc_ind + uVar4;
  uVar5 = puVar1[-1];
  puVar3 = ix_arr + end + 1;
  puVar7 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                     (ix_arr + st,puVar3);
  local_98 = (end - st) + 1;
  lVar13 = (longdouble)0;
  local_c0 = 0;
  lVar12 = lVar13;
LAB_0021e085:
  puVar2 = Xc_ind + uVar9;
  do {
    if (((puVar7 == puVar3) || (uVar9 == uVar4)) || (uVar6 = *puVar7, uVar5 < uVar6)) {
LAB_0021e1fd:
      if (local_c0 == 0) {
        *x_mean = 0.0;
        dVar14 = 0.0;
      }
      else {
        if (local_c0 < local_98) {
          lVar10 = (longdouble)(long)local_98 +
                   (longdouble)(float)(&DAT_003250d8)[(long)local_98 < 0];
          lVar11 = ((longdouble)(long)local_c0 +
                   (longdouble)(float)(&DAT_003250d8)[(long)local_c0 < 0]) / lVar10;
          lVar12 = lVar13 * lVar13 *
                   ((longdouble)1 - lVar11) *
                   ((longdouble)(long)local_c0 +
                   (longdouble)(float)(&DAT_003250d8)[(long)local_c0 < 0]) + lVar12;
          lVar13 = lVar13 * lVar11;
        }
        else {
          lVar10 = (longdouble)(long)local_98 +
                   (longdouble)(float)(&DAT_003250d8)[(long)local_98 < 0];
        }
        *x_mean = (double)lVar13;
        dVar14 = (double)SQRT(lVar12 / lVar10);
      }
      *x_sd = dVar14;
      return;
    }
    if (*puVar2 == uVar6) {
      if ((ulong)ABS(Xc[uVar9]) < 0x7ff0000000000000) {
        local_c0 = local_c0 + 1;
        lVar13 = ((longdouble)Xc[uVar9] - lVar13) /
                 ((longdouble)(long)local_c0 +
                 (longdouble)(float)(&DAT_003250d8)[(long)local_c0 < 0]) + lVar13;
        lVar10 = in_ST1;
        fmal();
        lVar12 = in_ST0;
        in_ST0 = in_ST1;
        in_ST1 = lVar10;
      }
      else {
        local_98 = local_98 - 1;
      }
      if ((puVar7 == ix_arr + end) || (uVar9 == uVar4 - 1)) goto LAB_0021e1fd;
      puVar7 = puVar7 + 1;
      puVar8 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                         (puVar2 + 1,puVar1,puVar7);
      uVar9 = (long)puVar8 - (long)Xc_ind >> 3;
      goto LAB_0021e085;
    }
    if (*puVar2 <= uVar6) break;
    puVar7 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                       (puVar7 + 1,puVar3,puVar2);
  } while( true );
  puVar8 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                     (puVar2 + 1,puVar1,puVar7);
  uVar9 = (long)puVar8 - (long)Xc_ind >> 3;
  goto LAB_0021e085;
}

Assistant:

void calc_mean_and_sd_(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                      real_t_ *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                      double &restrict x_sd, double &restrict x_mean)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
    {
        x_sd   = 0;
        x_mean = 0;
        return;
    }
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = (size_t) Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, (size_t)Xc_ind[st_col]);

    size_t cnt = end - st + 1;
    size_t added = 0;
    real_t m = 0;
    real_t s = 0;
    real_t m_prev = 0;

    for (size_t *row = ptr_st;
         row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
        )
    {
        if (Xc_ind[curr_pos] == (sparse_ix)(*row))
        {
            if (unlikely(is_na_or_inf(Xc[curr_pos])))
            {
                cnt--;
            }

            else
            {
                if (added == 0) m_prev = Xc[curr_pos];
                m += (Xc[curr_pos] - m) / (real_t)(++added);
                s  = std::fma(Xc[curr_pos] - m, Xc[curr_pos] - m_prev, s);
                m_prev = m;
            }

            if (row == ix_arr + end || curr_pos == end_col) break;
            curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
        }

        else
        {
            if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
            else
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
        }
    }

    if (added == 0)
    {
        x_mean = 0;
        x_sd = 0;
        return;
    }

    /* Note: up to this point:
         m = sum(x)/nnz
         s = sum(x^2) - (1/nnz)*(sum(x)^2)
       Here the standard deviation is given by:
         sigma = (1/n)*(sum(x^2) - (1/n)*(sum(x)^2))
       The difference can be put to a closed form. */
    if (cnt > added)
    {
        s += square(m) * ((real_t)added * ((real_t)1 - (real_t)added/(real_t)cnt));
        m *= (real_t)added / (real_t)cnt;
    }

    x_mean = m;
    x_sd   = std::sqrt(s / (real_t)cnt);
}